

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_get_str_kv_size_test(void)

{
  char str [11];
  size_t size;
  int v;
  void *key;
  btree *tree;
  btree_kv_ops *kv_ops;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined1 uStackY_148;
  undefined1 local_147;
  btree_kv_ops *in_stack_fffffffffffffec0;
  key_len_t in_stack_fffffffffffffece;
  char *in_stack_fffffffffffffed0;
  undefined1 local_108 [133];
  char local_83 [11];
  ulong local_78;
  undefined4 local_6c;
  void *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  builtin_strncpy(local_83,"teststring",0xb);
  local_58 = local_108;
  btree_str_kv_get_kb64_vb64(in_stack_fffffffffffffec0);
  local_147 = 4;
  local_6c = 1;
  local_60 = &uStackY_148;
  construct_key_ptr(in_stack_fffffffffffffed0,in_stack_fffffffffffffece,in_stack_fffffffffffffec0);
  local_78 = (**(code **)(local_58 + 0x28))(local_60,&local_68,&local_6c);
  if (local_78 != (ulong)(byte)local_60[1] + 0xd) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x344);
    kv_get_str_kv_size_test::__test_pass = 0;
    if (local_78 != (ulong)(byte)local_60[1] + 0xd) {
      __assert_fail("size == (sizeof(str) + sizeof(key_len_t) + tree->vsize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x344,"void kv_get_str_kv_size_test()");
    }
  }
  local_78 = (**(code **)(local_58 + 0x28))(local_60,0,&local_6c);
  if (local_78 != (byte)local_60[1]) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x348);
    kv_get_str_kv_size_test::__test_pass = 0;
    if (local_78 != (byte)local_60[1]) {
      __assert_fail("size == (tree->vsize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x348,"void kv_get_str_kv_size_test()");
    }
  }
  local_78 = (**(code **)(local_58 + 0x28))(local_60,&local_68,0);
  if (local_78 != 0xd) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x34c);
    kv_get_str_kv_size_test::__test_pass = 0;
    if (local_78 != 0xd) {
      __assert_fail("size == (sizeof(str) + sizeof(key_len_t))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x34c,"void kv_get_str_kv_size_test()");
    }
  }
  local_78 = (**(code **)(local_58 + 0x28))(local_60,0);
  if (local_78 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x350);
    kv_get_str_kv_size_test::__test_pass = 0;
    if (local_78 != 0) {
      __assert_fail("size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x350,"void kv_get_str_kv_size_test()");
    }
  }
  free(local_68);
  memleak_end();
  if (kv_get_str_kv_size_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv_get_str_kv_size_test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv_get_str_kv_size_test");
  }
  return;
}

Assistant:

void kv_get_str_kv_size_test()
{
    TEST_INIT();
    memleak_start();

    btree_kv_ops *kv_ops;
    btree *tree;
    void *key;
    int v;
    size_t size;
    char str[] = "teststring";

    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);
    tree = alca(struct btree, 1);
    tree->vsize = sizeof(v);
    v = 1;
    construct_key_ptr(str, sizeof(str), &key);

    // get/verify size of kv string
    size = kv_ops->get_kv_size(tree, &key, (void *)&v);
    TEST_CHK(size == (sizeof(str) + sizeof(key_len_t) + tree->vsize));

    // verify with NULL key
    size = kv_ops->get_kv_size(tree, NULL, (void *)&v);
    TEST_CHK(size == (tree->vsize));

    // verify with NULL value
    size = kv_ops->get_kv_size(tree, &key, NULL);
    TEST_CHK(size == (sizeof(str) + sizeof(key_len_t)));

    // NULL key/value
    size = kv_ops->get_kv_size(tree, NULL, NULL);
    TEST_CHK(size == 0);

    free(key);
    memleak_end();
    TEST_RESULT("kv_get_str_kv_size_test");
}